

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O0

int register_log_suite(zt_unit *unit)

{
  zt_unit_suite *test_fn;
  zt_unit_try_fn in_RDI;
  zt_unit_suite *unaff_retaddr;
  zt_unit_suite *suite;
  char *in_stack_00000018;
  zt_unit *in_stack_00000020;
  
  test_fn = zt_unit_register_suite_
                      (in_stack_00000020,in_stack_00000018,(zt_unit_setup_fn)unit,
                       (zt_unit_teardown_fn)suite,unaff_retaddr,in_RDI);
  zt_unit_register_test(unaff_retaddr,(char *)in_RDI,(zt_unit_test_fn)test_fn);
  zt_unit_register_test(unaff_retaddr,(char *)in_RDI,(zt_unit_test_fn)test_fn);
  return 0;
}

Assistant:

int
register_log_suite(struct zt_unit *unit)
{
    struct zt_unit_suite * suite;

    suite = zt_unit_register_suite(unit, "logging tests", NULL, NULL, NULL);
    zt_unit_register_test(suite, "basic", basic_tests);
#ifdef HAVE_PTHREADS
    zt_unit_register_test(suite, "threaded", threaded_tests);
#endif /* HAVE_PTHREADS */

    return 0;
}